

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfQueue.c
# Opt level: O2

void sbfQueue_destroy(sbfQueue queue)

{
  sbfLog_log(queue->mLog,0,"destroying queue %p",queue);
  sbfHiResTimer_queueDestroy(queue);
  LOCK();
  (queue->mRefCount).mRefCount = (queue->mRefCount).mRefCount + 1;
  UNLOCK();
  sbfQueue_enqueue(queue,(sbfQueueCb)0x0,(void *)0x0);
  queue->mExited = 1;
  sbfQueue_removeRef(queue);
  return;
}

Assistant:

void
sbfQueue_destroy (sbfQueue queue)
{
    sbfLog_debug (queue->mLog, "destroying queue %p", queue);

    sbfHiResTimer_queueDestroy (queue);

    sbfQueue_addRef (queue);
    sbfQueue_enqueue (queue, NULL, NULL);
    queue->mExited = 1;

    sbfQueue_removeRef (queue);
}